

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O1

ZCC_Expression * __thiscall
ZCCCompiler::NodeFromSymbol
          (ZCCCompiler *this,PSymbol *sym,ZCC_Expression *source,PSymbolTable *table)

{
  PSymbolTable *pPVar1;
  PClass *pPVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ZCC_ExprConstant *pZVar5;
  undefined4 extraout_var_01;
  PClass *pPVar6;
  ZCC_Expression *pZVar7;
  PClassPointer *pPVar8;
  PClass *pPVar9;
  bool bVar10;
  
  pPVar6 = PSymbolTreeNode::RegistrationInfo.MyClass;
  if (sym == (PSymbol *)0x0) {
    __assert_fail("sym != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_compile.cpp"
                  ,0x232,
                  "ZCC_Expression *ZCCCompiler::NodeFromSymbol(PSymbol *, ZCC_Expression *, PSymbolTable *)"
                 );
  }
  if ((sym->super_DObject).Class == (PClass *)0x0) {
    iVar4 = (**(sym->super_DObject)._vptr_DObject)(sym);
    (sym->super_DObject).Class = (PClass *)CONCAT44(extraout_var,iVar4);
  }
  if ((sym->super_DObject).Class == pPVar6) {
    pPVar1 = this->Symbols;
    this->Symbols = table;
    sym = CompileNode(this,(ZCC_NamedNode *)sym[1].super_DObject._vptr_DObject);
    this->Symbols = pPVar1;
    if ((PSymbolConst *)sym == (PSymbolConst *)0x0) {
      return (ZCC_Expression *)0x0;
    }
  }
  pPVar6 = PSymbolConst::RegistrationInfo.MyClass;
  if ((((PSymbolConst *)sym)->super_PSymbol).super_DObject.Class == (PClass *)0x0) {
    iVar4 = (**(((PSymbolConst *)sym)->super_PSymbol).super_DObject._vptr_DObject)(sym);
    (((PSymbolConst *)sym)->super_PSymbol).super_DObject.Class =
         (PClass *)CONCAT44(extraout_var_00,iVar4);
  }
  pPVar3 = PSymbolType::RegistrationInfo.MyClass;
  pPVar2 = (((PSymbolConst *)sym)->super_PSymbol).super_DObject.Class;
  bVar10 = pPVar2 != (PClass *)0x0;
  pPVar9 = pPVar2;
  if (pPVar2 != pPVar6 && bVar10) {
    do {
      pPVar9 = pPVar9->ParentClass;
      bVar10 = pPVar9 != (PClass *)0x0;
      if (pPVar9 == pPVar6) break;
    } while (pPVar9 != (PClass *)0x0);
  }
  if (bVar10) {
    pZVar5 = NodeFromSymbolConst(this,(PSymbolConst *)sym,source);
    return &pZVar5->super_ZCC_Expression;
  }
  if (pPVar2 == (PClass *)0x0) {
    iVar4 = (**(((PSymbolConst *)sym)->super_PSymbol).super_DObject._vptr_DObject)(sym);
    (((PSymbolConst *)sym)->super_PSymbol).super_DObject.Class =
         (PClass *)CONCAT44(extraout_var_01,iVar4);
  }
  pPVar6 = (((PSymbolConst *)sym)->super_PSymbol).super_DObject.Class;
  bVar10 = pPVar6 != (PClass *)0x0;
  if (pPVar6 != pPVar3 && bVar10) {
    do {
      pPVar6 = pPVar6->ParentClass;
      bVar10 = pPVar6 != (PClass *)0x0;
      if (pPVar6 == pPVar3) break;
    } while (pPVar6 != (PClass *)0x0);
  }
  if (!bVar10) {
    return (ZCC_Expression *)0x0;
  }
  pZVar7 = (ZCC_Expression *)
           ZCC_AST::InitNode(this->AST,0x38,AST_ExprTypeRef,&source->super_ZCC_TreeNode);
  pZVar7->Operation = PEX_TypeRef;
  pZVar7[1].super_ZCC_TreeNode.SiblingNext = (ZCC_TreeNode *)((PSymbolConst *)sym)->ValueType;
  pPVar8 = NewClassPointer(PType::RegistrationInfo.MyClass);
  pZVar7->Type = (PType *)pPVar8;
  return pZVar7;
}

Assistant:

ZCC_Expression *ZCCCompiler::NodeFromSymbol(PSymbol *sym, ZCC_Expression *source, PSymbolTable *table)
{
	assert(sym != NULL);
	if (sym->IsA(RUNTIME_CLASS(PSymbolTreeNode)))
	{
		PSymbolTable *prevtable = Symbols;
		Symbols = table;
		sym = CompileNode(static_cast<PSymbolTreeNode *>(sym)->Node);
		Symbols = prevtable;
		if (sym == NULL)
		{
			return NULL;
		}
	}
	if (sym->IsKindOf(RUNTIME_CLASS(PSymbolConst)))
	{
		return NodeFromSymbolConst(static_cast<PSymbolConst *>(sym), source);
	}
	else if (sym->IsKindOf(RUNTIME_CLASS(PSymbolType)))
	{
		return NodeFromSymbolType(static_cast<PSymbolType *>(sym), source);
	}
	return NULL;
}